

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

void __thiscall
wabt::AST::Construct(AST *this,ExprList *es,Index nresults,Index nparams,bool is_function_body)

{
  intrusive_list<wabt::Expr> *this_00;
  bool bVar1;
  ExprType EVar2;
  size_type sVar3;
  reference e_00;
  int *piVar4;
  reference pvVar5;
  reference pvVar6;
  const_iterator rhs;
  Arities AVar7;
  byte local_1b1;
  reference local_1a8;
  long local_198;
  size_type size;
  Node *local_188;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_180;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_178;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_170;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *local_168;
  vector<wabt::Node,_std::allocator<wabt::Node>_> *local_160;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_158;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_150;
  size_type local_148;
  size_type end;
  Node *local_138;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_130;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_128;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_120;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_118;
  __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_> local_110;
  undefined1 local_108 [8];
  type void_exp;
  anon_class_16_2_0af2ad8c GenFlushedVars;
  anon_class_16_2_c2519580 MoveStatementsBelowVars;
  anon_class_16_2_c25194c6 GenFlushVars;
  int num_vals;
  int num_vars;
  Index local_8c;
  uint uStack_88;
  Arities arity;
  Expr *e;
  const_iterator __end2;
  const_iterator __begin2;
  ExprList *__range2;
  int local_38;
  int iStack_34;
  bool unreachable;
  int value_stack_in_variables;
  int value_stack_depth_start;
  size_type start;
  Index local_20;
  Index IStack_1c;
  bool is_function_body_local;
  Index nparams_local;
  Index nresults_local;
  ExprList *es_local;
  AST *this_local;
  
  start._7_1_ = is_function_body;
  local_20 = nparams;
  IStack_1c = nresults;
  _nparams_local = es;
  es_local = (ExprList *)this;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->block_stack,&this->cur_block_id);
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(&this->blocks_closed);
  this->cur_block_id = sVar3;
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->blocks_closed,false);
  _value_stack_in_variables =
       std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size(&this->exp_stack);
  this_00 = _nparams_local;
  iStack_34 = this->value_stack_depth - local_20;
  local_38 = this->value_stack_depth;
  __range2._7_1_ = 0;
  join_0x00000010_0x00000000_ = intrusive_list<wabt::Expr>::begin(_nparams_local);
  rhs = intrusive_list<wabt::Expr>::end(this_00);
  while (bVar1 = intrusive_list<wabt::Expr>::const_iterator::operator!=
                           ((const_iterator *)&__end2.node_,rhs), bVar1) {
    e_00 = intrusive_list<wabt::Expr>::const_iterator::operator*((const_iterator *)&__end2.node_);
    Construct(this,e_00);
    AVar7 = ModuleContext::GetExprArity(this->mc,e_00);
    local_8c = AVar7.nargs;
    this->value_stack_depth = this->value_stack_depth - local_8c;
    piVar4 = std::min<int>(&local_38,&this->value_stack_depth);
    local_38 = *piVar4;
    local_1b1 = 1;
    if (__range2._7_1_ == 0) {
      local_1b1 = AVar7.unreachable;
    }
    __range2._7_1_ = local_1b1 & 1;
    bVar1 = true;
    if (__range2._7_1_ == 0) {
      bVar1 = iStack_34 <= this->value_stack_depth;
    }
    if (!bVar1) {
      __assert_fail("unreachable || value_stack_depth >= value_stack_depth_start",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/decompiler-ast.h"
                    ,0x103,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
    }
    uStack_88 = AVar7.nreturns;
    this->value_stack_depth = uStack_88 + this->value_stack_depth;
    if (uStack_88 == 1) {
      EVar2 = Expr::type(e_00);
      if ((EVar2 == Const) && (local_38 == this->value_stack_depth + -1)) {
        local_38 = local_38 + 1;
      }
    }
    else {
      GenFlushVars.num_vals._4_4_ = local_38 - iStack_34;
      GenFlushVars.num_vals._0_4_ = this->value_stack_depth - local_38;
      GenFlushVars.this = (AST *)&GenFlushVars.num_vals;
      MoveStatementsBelowVars.this = (AST *)((long)&GenFlushVars.num_vals + 4);
      void_exp.u.var = (Var *)&GenFlushVars.num_vals;
      GenFlushedVars.num_vals = (int *)this;
      GenFlushedVars.this = this;
      MoveStatementsBelowVars.num_vars = (int *)this;
      if ((uStack_88 == 0) && (iStack_34 < this->value_stack_depth)) {
        if ((int)GenFlushVars.num_vals < 1) {
          local_120._M_current =
               (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
          local_118 = __gnu_cxx::
                      __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                      ::operator-(&local_120,(long)GenFlushVars.num_vals._4_4_);
          local_110 = __gnu_cxx::
                      __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                      ::operator-(&local_118,1);
          local_130._M_current =
               (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
          local_128 = __gnu_cxx::
                      __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                      ::operator-(&local_130,1);
          local_138 = (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end
                                        (&this->exp_stack);
          end = (size_type)
                std::_V2::
                rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                          (local_110,local_128,
                           (__normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                            )local_138);
        }
        else {
          pvVar5 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::back(&this->exp_stack);
          Node::Node((Node *)local_108,pvVar5);
          std::vector<wabt::Node,_std::allocator<wabt::Node>_>::pop_back(&this->exp_stack);
          Construct::anon_class_16_2_c25194c6::operator()
                    ((anon_class_16_2_c25194c6 *)&MoveStatementsBelowVars.num_vars,
                     (int)GenFlushVars.num_vals);
          std::vector<wabt::Node,_std::allocator<wabt::Node>_>::push_back
                    (&this->exp_stack,(value_type *)local_108);
          Construct::anon_class_16_2_c2519580::operator()
                    ((anon_class_16_2_c2519580 *)&GenFlushedVars.this,2);
          Construct::anon_class_16_2_0af2ad8c::operator()
                    ((anon_class_16_2_0af2ad8c *)&void_exp.u.field_0);
          Node::~Node((Node *)local_108);
        }
        local_38 = this->value_stack_depth;
      }
      else if (1 < uStack_88) {
        if ((int)GenFlushVars.num_vals < (int)uStack_88) {
          __assert_fail("num_vals >= static_cast<int>(arity.nreturns)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/decompiler-ast.h"
                        ,0x145,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
        }
        Construct::anon_class_16_2_c25194c6::operator()
                  ((anon_class_16_2_c25194c6 *)&MoveStatementsBelowVars.num_vars,
                   ((int)GenFlushVars.num_vals - uStack_88) + 1);
        Construct::anon_class_16_2_c2519580::operator()
                  ((anon_class_16_2_c2519580 *)&GenFlushedVars.this,1);
        Construct::anon_class_16_2_0af2ad8c::operator()
                  ((anon_class_16_2_0af2ad8c *)&void_exp.u.field_0);
        local_38 = this->value_stack_depth;
      }
    }
    intrusive_list<wabt::Expr>::const_iterator::operator++((const_iterator *)&__end2.node_);
  }
  bVar1 = true;
  if (__range2._7_1_ == 0) {
    bVar1 = this->value_stack_depth - iStack_34 == IStack_1c;
  }
  if (!bVar1) {
    __assert_fail("unreachable || value_stack_depth - value_stack_depth_start == static_cast<int>(nresults)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/decompiler-ast.h"
                  ,0x15b,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
  }
  this->value_stack_depth = iStack_34;
  local_148 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size(&this->exp_stack);
  if (local_148 < _value_stack_in_variables) {
    __assert_fail("end >= start",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/decompiler-ast.h"
                  ,0x160,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
  }
  if ((start._7_1_ & 1) != 0) {
    bVar1 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::empty(&this->exp_stack);
    if (!bVar1) {
      pvVar5 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::back(&this->exp_stack);
      if (pvVar5->etype == Return) {
        pvVar5 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::back(&this->exp_stack);
        bVar1 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::empty(&pvVar5->children);
        if (bVar1) {
          std::vector<wabt::Node,_std::allocator<wabt::Node>_>::pop_back(&this->exp_stack);
        }
      }
      else if (IStack_1c != 0) {
        InsertNode(this,EndReturn,Nop,(Expr *)0x0,IStack_1c);
      }
    }
    local_150._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::begin(&this->predecls);
    local_158._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->predecls);
    local_160 = (vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                std::back_inserter<std::vector<wabt::Node,std::allocator<wabt::Node>>>
                          (&this->exp_stack);
    local_168 = (vector<wabt::Node,_std::allocator<wabt::Node>_> *)
                std::
                move<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>,std::back_insert_iterator<std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                          (local_150,local_158,
                           (back_insert_iterator<std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                            )local_160);
    local_170._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::begin(&this->exp_stack);
    local_180._M_current =
         (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
    sVar3 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size(&this->predecls);
    local_178 = __gnu_cxx::
                __normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                ::operator-(&local_180,sVar3);
    local_188 = (Node *)std::vector<wabt::Node,_std::allocator<wabt::Node>_>::end(&this->exp_stack);
    size = (size_type)
           std::_V2::
           rotate<__gnu_cxx::__normal_iterator<wabt::Node*,std::vector<wabt::Node,std::allocator<wabt::Node>>>>
                     (local_170,local_178,
                      (__normal_iterator<wabt::Node_*,_std::vector<wabt::Node,_std::allocator<wabt::Node>_>_>
                       )local_188);
    std::vector<wabt::Node,_std::allocator<wabt::Node>_>::clear(&this->predecls);
  }
  local_148 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::size(&this->exp_stack);
  if (local_148 < _value_stack_in_variables) {
    __assert_fail("end >= start",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/decompiler-ast.h"
                  ,0x17a,"void wabt::AST::Construct(const ExprList &, Index, Index, bool)");
  }
  local_198 = local_148 - _value_stack_in_variables;
  if (local_198 != 1) {
    InsertNode(this,Statements,Nop,(Expr *)0x0,(Index)local_198);
  }
  local_1a8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->blocks_closed,this->cur_block_id);
  std::_Bit_reference::operator=(&local_1a8,true);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->block_stack);
  this->cur_block_id = *pvVar6;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&this->block_stack);
  return;
}

Assistant:

void Construct(const ExprList& es,
                 Index nresults,
                 Index nparams,
                 bool is_function_body) {
    block_stack.push_back(cur_block_id);
    cur_block_id = blocks_closed.size();
    blocks_closed.push_back(false);
    auto start = exp_stack.size();
    int value_stack_depth_start = value_stack_depth - nparams;
    auto value_stack_in_variables = value_stack_depth;
    bool unreachable = false;
    for (auto& e : es) {
      Construct(e);
      auto arity = mc.GetExprArity(e);
      value_stack_depth -= arity.nargs;
      value_stack_in_variables =
          std::min(value_stack_in_variables, value_stack_depth);
      unreachable = unreachable || arity.unreachable;
      assert(unreachable || value_stack_depth >= value_stack_depth_start);
      value_stack_depth += arity.nreturns;
      // We maintain the invariant that a value_stack_depth of N is represented
      // by the last N exp_stack items (each of which returning exactly 1
      // value), all exp_stack items before it return void ("statements").
      // In particular for the wasm stack:
      // - The values between 0 and value_stack_depth_start are part of the
      //   parent block, and not touched here.
      // - The values from there up to value_stack_in_variables are variables
      //   to be used, representing previous statements that flushed the
      //   stack into variables.
      // - Values on top of that up to value_stack_depth are exps returning
      //   a single value.
      // The code below maintains the above invariants. With this in place
      // code "falls into place" the way you expect it.
      if (arity.nreturns != 1) {
        auto num_vars = value_stack_in_variables - value_stack_depth_start;
        auto num_vals = value_stack_depth - value_stack_in_variables;
        auto GenFlushVars = [&](int nargs) {
          auto& ftv =
              InsertNode(NodeType::FlushToVars, ExprType::Nop, nullptr, nargs);
          ftv.u.var_start = flushed_vars;
          ftv.u.var_count = num_vals;
        };
        auto MoveStatementsBelowVars = [&](size_t amount) {
          std::rotate(exp_stack.end() - num_vars - amount,
                      exp_stack.end() - amount, exp_stack.end());
        };
        auto GenFlushedVars = [&]() {
          // Re-generate these values as vars.
          for (int i = 0; i < num_vals; i++) {
            auto& fv =
                InsertNode(NodeType::FlushedVar, ExprType::Nop, nullptr, 0);
            fv.u.var_start = flushed_vars++;
            fv.u.var_count = 1;
          }
        };
        if (arity.nreturns == 0 &&
            value_stack_depth > value_stack_depth_start) {
          // We have a void item on top of the exp_stack, so we must "lift" the
          // previous values around it.
          // We track what part of the stack is in variables to avoid doing
          // this unnecessarily.
          if (num_vals > 0) {
            // We have actual new values that need lifting.
            // This puts the part of the stack that wasn't already a variable
            // (before the current void exp) into a FlushToVars.
            auto void_exp = std::move(exp_stack.back());
            exp_stack.pop_back();
            GenFlushVars(num_vals);
            exp_stack.push_back(std::move(void_exp));
            // Put this flush statement + void statement before any
            // existing variables.
            MoveStatementsBelowVars(2);
            // Now re-generate these values after the void exp as vars.
            GenFlushedVars();
          } else {
            // We have existing variables that need lifting, but no need to
            // create them anew.
            std::rotate(exp_stack.end() - num_vars - 1, exp_stack.end() - 1,
                        exp_stack.end());
          }
          value_stack_in_variables = value_stack_depth;
        } else if (arity.nreturns > 1) {
          // Multivalue: we flush the stack also.
          // Number of other non-variable values that may be present:
          assert(num_vals >= static_cast<int>(arity.nreturns));
          // Flush multi-value exp + others.
          GenFlushVars(num_vals - arity.nreturns + 1);
          // Put this flush statement before any existing variables.
          MoveStatementsBelowVars(1);
          GenFlushedVars();
          value_stack_in_variables = value_stack_depth;
        }
      } else {
        // Special optimisation: for constant instructions, we can mark these
        // as if they were variables, so they can be re-ordered for free with
        // the above code, without needing new variables!
        // TODO: this would be nice to also do for local.get and maybe others,
        // though that needs a way to ensure there's no local.set in between
        // when they get lifted, so complicates matters a bit.
        if (e.type() == ExprType::Const &&
            value_stack_in_variables == value_stack_depth - 1) {
          value_stack_in_variables++;
        }
      }
    }
    assert(unreachable || value_stack_depth - value_stack_depth_start ==
                              static_cast<int>(nresults));
    // Undo any changes to value_stack_depth, since parent takes care of arity
    // changes.
    value_stack_depth = value_stack_depth_start;
    auto end = exp_stack.size();
    assert(end >= start);
    if (is_function_body) {
      if (!exp_stack.empty()) {
        if (exp_stack.back().etype == ExprType::Return) {
          if (exp_stack.back().children.empty()) {
            // Return statement at the end of a void function.
            exp_stack.pop_back();
          }
        } else if (nresults) {
          // Combine nresults into a return statement, for when this is used as
          // a function body.
          // TODO: if this is some other kind of block and >1 value is being
          // returned, probably need some kind of syntax to make that clearer.
          InsertNode(NodeType::EndReturn, ExprType::Nop, nullptr, nresults);
        }
      }
      // TODO: these predecls are always at top level, but in the case of
      // use inside an exp, it be nice to do it in the current block. Can't
      // do that for predecls that are "out if scope" however.
      std::move(predecls.begin(), predecls.end(),
                std::back_inserter(exp_stack));
      std::rotate(exp_stack.begin(), exp_stack.end() - predecls.size(),
                  exp_stack.end());
      predecls.clear();
    }
    end = exp_stack.size();
    assert(end >= start);
    auto size = end - start;
    if (size != 1) {
      InsertNode(NodeType::Statements, ExprType::Nop, nullptr, size);
    }
    blocks_closed[cur_block_id] = true;
    cur_block_id = block_stack.back();
    block_stack.pop_back();
  }